

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O2

void ssw_strcat(char *dest,char *src,size_t destbuflen)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = ssw_strlen(dest,destbuflen);
  sVar2 = ssw_strlen(src,destbuflen);
  if (sVar2 == 0) {
    return;
  }
  if (!(bool)(~CARRY8(sVar2,sVar1) & sVar2 + sVar1 <= destbuflen)) {
    ssw_error("ssw_strcat: resulting string size out of range");
  }
  memcpy(dest + sVar1,src,sVar2 + 1);
  return;
}

Assistant:

void ssw_strcat( char * dest, const char * src, size_t destbuflen )
{
  size_t nd = ssw_strlen( dest, destbuflen );
  size_t ns = ssw_strlen( src, destbuflen );
  size_t n = nd + ns;
  if (!ns)
    return;
  if ( n < nd || n < ns || n > destbuflen )
    ssw_error("ssw_strcat: resulting string size out of range");
  memcpy( dest + nd, src, ns+1 );
}